

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConfigData::ConfigData(ConfigData *this,ConfigData *param_1)

{
  Level LVar1;
  What WVar2;
  OrNot OVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined3 uVar13;
  int iVar14;
  ConfigData *param_1_local;
  ConfigData *this_local;
  
  bVar4 = param_1->listTests;
  bVar5 = param_1->listTags;
  bVar6 = param_1->listReporters;
  bVar7 = param_1->listTestNamesOnly;
  bVar8 = param_1->showSuccessfulTests;
  bVar9 = param_1->shouldDebugBreak;
  bVar10 = param_1->noThrow;
  bVar11 = param_1->showHelp;
  bVar12 = param_1->showInvisibles;
  uVar13 = *(undefined3 *)&param_1->field_0x9;
  iVar14 = param_1->abortAfter;
  LVar1 = param_1->verbosity;
  WVar2 = param_1->warnings;
  OVar3 = param_1->showDurations;
  this->abortAfter = param_1->abortAfter;
  this->verbosity = LVar1;
  this->warnings = WVar2;
  this->showDurations = OVar3;
  this->listTests = bVar4;
  this->listTags = bVar5;
  this->listReporters = bVar6;
  this->listTestNamesOnly = bVar7;
  this->showSuccessfulTests = bVar8;
  this->shouldDebugBreak = bVar9;
  this->noThrow = bVar10;
  this->showHelp = bVar11;
  this->showInvisibles = bVar12;
  *(undefined3 *)&this->field_0x9 = uVar13;
  this->abortAfter = iVar14;
  std::__cxx11::string::string((string *)&this->reporterName,(string *)&param_1->reporterName);
  std::__cxx11::string::string((string *)&this->outputFilename,(string *)&param_1->outputFilename);
  std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  std::__cxx11::string::string((string *)&this->processName,(string *)&param_1->processName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->testsOrTags,&param_1->testsOrTags);
  return;
}

Assistant:

ConfigData()
        :   listTests( false ),
            listTags( false ),
            listReporters( false ),
            listTestNamesOnly( false ),
            showSuccessfulTests( false ),
            shouldDebugBreak( false ),
            noThrow( false ),
            showHelp( false ),
            showInvisibles( false ),
            abortAfter( -1 ),
            verbosity( Verbosity::Normal ),
            warnings( WarnAbout::Nothing ),
            showDurations( ShowDurations::DefaultForReporter )
        {}